

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O2

void __thiscall CovarianceMatrix::generateCode(CovarianceMatrix *this)

{
  unsigned_long *puVar1;
  CovarianceMatrix *this_00;
  ostream *poVar2;
  pointer ppQVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  string local_5e0;
  CovarianceMatrix *local_5c0;
  pointer local_5b8;
  string local_5b0;
  string runFunction;
  string dumpListOfQueries;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream ofs;
  
  std::__cxx11::string::string((string *)&dumpListOfQueries,"",(allocator *)&ofs);
  local_5b8 = (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_5c0 = this;
  for (ppQVar3 = (this->listOfQueries).super__Vector_base<Query_*,_std::allocator<Query_*>_>._M_impl
                 .super__Vector_impl_data._M_start; this_00 = local_5c0, ppQVar3 != local_5b8;
      ppQVar3 = ppQVar3 + 1) {
    puVar1 = *(unsigned_long **)
              &((*((*ppQVar3)->_aggregates).
                  super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->_incoming).
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data;
    std::__cxx11::to_string(&local_5e0,*puVar1);
    std::operator+(&local_600,&local_5e0,",");
    std::__cxx11::to_string(&local_5b0,puVar1[1]);
    std::operator+(&runFunction,&local_600,&local_5b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                   &runFunction,"\\n");
    std::__cxx11::string::append((string *)&dumpListOfQueries);
    std::__cxx11::string::~string((string *)&ofs);
    std::__cxx11::string::~string((string *)&runFunction);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  Application::offset_abi_cxx11_(&local_450,&local_5c0->super_Application,1);
  std::operator+(&local_430,&local_450,"void runApplication()\n");
  Application::offset_abi_cxx11_(&local_470,&this_00->super_Application,1);
  std::operator+(&local_410,&local_430,&local_470);
  std::operator+(&local_3f0,&local_410,"{\n");
  Application::offset_abi_cxx11_(&local_490,&this_00->super_Application,2);
  std::operator+(&local_3d0,&local_3f0,&local_490);
  std::operator+(&local_3b0,&local_3d0,
                 "std::ofstream ofs(\"times.txt\",std::ofstream::out | std::ofstream::app);\n");
  Application::offset_abi_cxx11_(&local_4b0,&this_00->super_Application,2);
  std::operator+(&local_390,&local_3b0,&local_4b0);
  std::operator+(&local_370,&local_390,"ofs << \"\\n\";\n");
  Application::offset_abi_cxx11_(&local_4d0,&this_00->super_Application,2);
  std::operator+(&local_350,&local_370,&local_4d0);
  std::operator+(&local_330,&local_350,"ofs.close();\n\n");
  std::operator+(&local_310,&local_330,"#ifdef DUMP_OUTPUT\n");
  Application::offset_abi_cxx11_(&local_4f0,&this_00->super_Application,2);
  std::operator+(&local_2f0,&local_310,&local_4f0);
  std::operator+(&local_2d0,&local_2f0,"ofs.open(\"output/covarianceMatrix.out\");\n");
  Application::offset_abi_cxx11_(&local_510,&this_00->super_Application,2);
  std::operator+(&local_2b0,&local_2d0,&local_510);
  std::operator+(&local_290,&local_2b0,"ofs << \"");
  std::operator+(&local_270,&local_290,&dumpListOfQueries);
  std::operator+(&local_250,&local_270,"\";\n");
  Application::offset_abi_cxx11_(&local_530,&this_00->super_Application,2);
  std::operator+(&local_5b0,&local_250,&local_530);
  std::operator+(&local_5e0,&local_5b0,"ofs.close();\n");
  std::operator+(&local_600,&local_5e0,"#endif /* DUMP_OUTPUT */ \n");
  Application::offset_abi_cxx11_(&local_550,&this_00->super_Application,1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,
                 &local_600,&local_550);
  std::operator+(&runFunction,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ofs,"}\n");
  std::__cxx11::string::~string((string *)&ofs);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::operator+(&local_600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"ApplicationHandler.h");
  std::ofstream::ofstream(&ofs,(string *)&local_600,_S_out);
  std::__cxx11::string::~string((string *)&local_600);
  poVar2 = std::operator<<((ostream *)&ofs,"#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n");
  poVar2 = std::operator<<(poVar2,"#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n");
  poVar2 = std::operator<<(poVar2,"#include \"DataHandler.h\"\n\n");
  poVar2 = std::operator<<(poVar2,"namespace lmfao\n{\n");
  Application::offset_abi_cxx11_(&local_5e0,&this_00->super_Application,1);
  std::operator+(&local_600,&local_5e0,"void runApplication();\n");
  poVar2 = std::operator<<(poVar2,(string *)&local_600);
  std::operator<<(poVar2,"}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n");
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::ofstream::close();
  std::operator+(&local_600,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 multifaq::dir::OUTPUT_DIRECTORY_abi_cxx11_,"ApplicationHandler.cpp");
  std::ofstream::open((string *)&ofs,(_Ios_Openmode)&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  poVar2 = std::operator<<((ostream *)&ofs,"#include \"ApplicationHandler.h\"\n");
  std::operator<<(poVar2,"namespace lmfao\n{\n");
  poVar2 = std::operator<<((ostream *)&ofs,(string *)&runFunction);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&ofs,"}\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  std::__cxx11::string::~string((string *)&runFunction);
  std::__cxx11::string::~string((string *)&dumpListOfQueries);
  return;
}

Assistant:

void CovarianceMatrix::generateCode()
{
    std::string dumpListOfQueries = "";

    for (Query* query : listOfQueries)
    {
        std::pair<size_t,size_t>& viewAggPair = query->_aggregates[0]->_incoming[0];
        
        dumpListOfQueries += std::to_string(viewAggPair.first)+","+
            std::to_string(viewAggPair.second)+"\\n";
    }
    
    std::string runFunction = offset(1)+"void runApplication()\n"+offset(1)+"{\n"+
        offset(2)+"std::ofstream ofs(\"times.txt\",std::ofstream::out | std::ofstream::app);\n"+
        offset(2)+"ofs << \"\\n\";\n"+
        offset(2)+"ofs.close();\n\n"+
        "#ifdef DUMP_OUTPUT\n"+
        offset(2)+"ofs.open(\"output/covarianceMatrix.out\");\n"+
        offset(2)+"ofs << \""+dumpListOfQueries+"\";\n"+
        offset(2)+"ofs.close();\n"+
        "#endif /* DUMP_OUTPUT */ \n"+
        offset(1)+"}\n";
    
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_APPLICATIONHANDLER_HPP_\n"<<
        "#define INCLUDE_APPLICATIONHANDLER_HPP_\n\n"<<
        "#include \"DataHandler.h\"\n\n"<<
        "namespace lmfao\n{\n"<<
        offset(1)+"void runApplication();\n"<<
        "}\n\n#endif /* INCLUDE_APPLICATIONHANDLER_HPP_*/\n";    
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"ApplicationHandler.cpp", std::ofstream::out);
    ofs << "#include \"ApplicationHandler.h\"\n"
        << "namespace lmfao\n{\n";
    ofs << runFunction << std::endl;
    ofs << "}\n";
    ofs.close();
}